

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

void __thiscall OpenMesh::PolyConnectivity::collapse(PolyConnectivity *this,HalfedgeHandle _hh)

{
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  Halfedge *pHVar1;
  
  pHVar1 = ArrayKernel::halfedge(&this->super_ArrayKernel,_hh);
  _heh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar1 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)
                      ((-((uint)_hh.super_BaseHandle.idx_ & 1) | 1) + (int)_hh.super_BaseHandle.idx_
                      ));
  _heh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  collapse_edge(this,_hh);
  pHVar1 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh);
  pHVar1 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)
                      (pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.
                      idx_);
  if ((BaseHandle)(pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
      == _heh.super_BaseHandle.idx_) {
    pHVar1 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh);
    collapse_loop(this,(HalfedgeHandle)
                       (pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.
                       idx_);
  }
  pHVar1 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_00);
  pHVar1 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)
                      (pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.
                      idx_);
  if ((BaseHandle)(pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
      == _heh_00.super_BaseHandle.idx_) {
    collapse_loop(this,_heh_00);
    return;
  }
  return;
}

Assistant:

void PolyConnectivity::collapse(HalfedgeHandle _hh)
{
  HalfedgeHandle h0 = _hh;
  HalfedgeHandle h1 = next_halfedge_handle(h0);
  HalfedgeHandle o0 = opposite_halfedge_handle(h0);
  HalfedgeHandle o1 = next_halfedge_handle(o0);

  // remove edge
  collapse_edge(h0);

  // remove loops
  if (next_halfedge_handle(next_halfedge_handle(h1)) == h1)
    collapse_loop(next_halfedge_handle(h1));
  if (next_halfedge_handle(next_halfedge_handle(o1)) == o1)
    collapse_loop(o1);
}